

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  pointer ppcVar1;
  char *pcVar2;
  int iVar3;
  pointer *__ptr;
  float grow;
  float fVar4;
  size_t bucket_count;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  float shrink_threshold;
  key_equal local_108;
  hasher local_f8;
  float local_ec;
  pair<google::dense_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_e8;
  AssertHelper local_c8;
  float local_bc;
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_b8;
  
  local_ec = 0.2;
  this_00 = &local_b8.
             super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  do {
    local_f8.id_ = 0;
    local_f8.num_hashes_ = 0;
    local_f8.num_compares_ = 0;
    local_108.id_ = 0;
    local_108.num_hashes_ = 0;
    local_108.num_compares_ = 0;
    local_e8.first.ht =
         (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)((ulong)local_e8.first.ht & 0xffffffff00000000);
    local_e8.first.pos = (pointer)0x0;
    google::
    HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet(&local_b8,0,&local_f8,&local_108,(allocator_type *)&local_e8);
    pcVar2 = UniqueObjectHelper<char_const*>(1);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(&this_00->rep);
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    use_deleted_ = true;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_factor_ = local_ec * 0.5;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_factor_ = local_ec;
    fVar4 = local_ec *
            (float)local_b8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (size_type)fVar4;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ =
         (long)(fVar4 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
               .enlarge_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
         enlarge_threshold_;
    if (0.0 <= local_b8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
               .shrink_factor_) {
      local_b8.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_factor_ = 0.0;
    }
    fVar4 = local_b8.
            super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
            shrink_factor_ *
            (float)local_b8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ = (size_type)fVar4;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(fVar4 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
               .shrink_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    local_f8.id_ = (int)local_ec;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.key_info.delkey = pcVar2;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e8,"grow_threshold","ht.max_load_factor()",&local_ec,
               (float *)&local_f8);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_f8);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((long *)local_f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_f8._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    local_f8._0_8_ = (long *)0x0;
    local_108.id_ =
         (int)local_b8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              shrink_factor_;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e8,"0.0","ht.min_load_factor()",(double *)&local_f8,
               (float *)&local_108);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_f8);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((long *)local_f8._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_f8._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&this_00->rep,0x4098);
    local_f8.id_ = (undefined4)
                   local_b8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_f8.num_hashes_ =
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    local_108._0_8_ = UniqueObjectHelper<char_const*>(2);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<char_const*const&,char_const*const&>
              (&local_e8,
               (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                *)this_00,(char **)&local_108,(char **)&local_108);
    local_e8.first.ht =
         (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
          *)UniqueObjectHelper<char_const*>(2);
    google::
    dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_00->rep,(key_type *)&local_e8);
    iVar3 = 2;
    while( true ) {
      local_108._0_8_ = UniqueObjectHelper<char_const*>(iVar3);
      google::
      dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&this_00->rep,1);
      google::
      dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
      ::insert_noresize<char_const*const&,char_const*const&>
                (&local_e8,
                 (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                  *)this_00,(char **)&local_108,(char **)&local_108);
      if (local_ec <=
          (float)(local_b8.
                  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_elements -
                 local_b8.
                 super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_deleted) / (float)(ulong)local_f8._0_8_) break;
      local_108.id_ =
           (undefined4)
           local_b8.
           super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.num_buckets;
      local_108.num_hashes_ =
           local_b8.
           super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.num_buckets._4_4_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e8,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f8
                 ,(unsigned_long *)&local_108);
      if ((char)local_e8.first.ht == '\0') {
        testing::Message::Message((Message *)&local_108);
        pcVar2 = "";
        if (local_e8.first.pos != (pointer)0x0) {
          pcVar2 = *local_e8.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)local_108._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_108._0_8_ + 8))();
        }
      }
      ppcVar1 = local_e8.first.pos;
      if (local_e8.first.pos != (pointer)0x0) {
        if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
          operator_delete(*local_e8.first.pos);
        }
        operator_delete(ppcVar1);
      }
      iVar3 = iVar3 + 1;
    }
    local_108.id_ =
         (undefined4)
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets;
    local_108.num_hashes_ =
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_e8,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_108,
               (unsigned_long *)&local_f8);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    fVar4 = (float)local_b8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_bc = (float)(local_b8.
                       super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.num_elements -
                      local_b8.
                      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.rep.num_deleted) / fVar4 + -0.01;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_factor_ = 0.5;
    if (local_bc <= 0.5) {
      local_b8.
      super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_factor_ = local_bc;
    }
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_factor_ = 1.0;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar4 - 9.223372e+18) & (long)fVar4 >> 0x3f | (long)fVar4;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (size_type)
         (local_b8.
          super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
          shrink_factor_ * fVar4);
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    shrink_threshold_ =
         (long)(local_b8.
                super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.settings.
                super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.shrink_factor_ *
                fVar4 - 9.223372e+18) &
         (long)local_b8.
               super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>
               .shrink_threshold_ >> 0x3f |
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = false;
    local_108._0_8_ = &DAT_3ff0000000000000;
    local_c8.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e8,"1.0","ht.max_load_factor()",(double *)&local_108,
               (float *)&local_c8);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    local_108.id_ =
         (int)local_b8.
              super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              .ht_.rep.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
              shrink_factor_;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e8,"shrink_threshold","ht.min_load_factor()",&local_bc,
               (float *)&local_108);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    local_f8.id_ = (undefined4)
                   local_b8.
                   super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_f8.num_hashes_ =
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    iVar3 = 2;
    while( true ) {
      local_e8.first.ht =
           (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)UniqueObjectHelper<char_const*>(iVar3);
      google::
      dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&this_00->rep,(key_type *)&local_e8);
      iVar3 = iVar3 + 1;
      local_e8.first.ht =
           (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            *)UniqueObjectHelper<char_const*>(iVar3);
      google::
      dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&this_00->rep,(key_type *)&local_e8);
      local_108._0_8_ = UniqueObjectHelper<char_const*>(iVar3);
      google::
      dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&this_00->rep,1);
      google::
      dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
      ::insert_noresize<char_const*const&,char_const*const&>
                (&local_e8,
                 (dense_hashtable<char_const*,char_const*,Hasher,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<char_const*,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                  *)this_00,(char **)&local_108,(char **)&local_108);
      if ((float)(local_b8.
                  super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_elements -
                 local_b8.
                 super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_deleted) / (float)(ulong)local_f8._0_8_ <= local_bc) break;
      local_108.id_ =
           (undefined4)
           local_b8.
           super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.num_buckets;
      local_108.num_hashes_ =
           local_b8.
           super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.num_buckets._4_4_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e8,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f8
                 ,(unsigned_long *)&local_108);
      if ((char)local_e8.first.ht == '\0') {
        testing::Message::Message((Message *)&local_108);
        pcVar2 = "";
        if (local_e8.first.pos != (pointer)0x0) {
          pcVar2 = *local_e8.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,pcVar2);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((long *)local_108._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_108._0_8_ + 8))();
        }
      }
      ppcVar1 = local_e8.first.pos;
      if (local_e8.first.pos != (pointer)0x0) {
        if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
          operator_delete(*local_e8.first.pos);
        }
        operator_delete(ppcVar1);
      }
    }
    local_108.id_ =
         (undefined4)
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets;
    local_108.num_hashes_ =
         local_b8.
         super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_e8,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_108,
               (unsigned_long *)&local_f8);
    if ((char)local_e8.first.ht == '\0') {
      testing::Message::Message((Message *)&local_108);
      pcVar2 = "";
      if (local_e8.first.pos != (pointer)0x0) {
        pcVar2 = *local_e8.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((long *)local_108._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_108._0_8_ + 8))();
      }
    }
    ppcVar1 = local_e8.first.pos;
    if (local_e8.first.pos != (pointer)0x0) {
      if ((pointer)*local_e8.first.pos != local_e8.first.pos + 2) {
        operator_delete(*local_e8.first.pos);
      }
      operator_delete(ppcVar1);
    }
    local_b8.
    super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
    ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c195f8;
    if (local_b8.
        super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.rep.table != (pointer)0x0) {
      free(local_b8.
           super_BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.table);
    }
    local_ec = local_ec + 0.2;
  } while (local_ec <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}